

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

string * __thiscall
cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *makefile,
          string *tgt)

{
  cmOutputConverter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGlobalGenerator *pcVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view source;
  string_view str;
  string_view str_00;
  string tgt2;
  string local_80;
  string local_50;
  
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  source._M_str = (makefile->_M_dataplus)._M_p;
  source._M_len = makefile->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_50,this_00,source,SHELL);
  tgt2._M_dataplus._M_p = (pointer)0x19;
  tgt2._M_string_length = (size_type)anon_var_dwarf_1ca6c78;
  tgt2.field_2._M_allocated_capacity = local_50._M_string_length;
  tgt2.field_2._8_8_ = local_50._M_dataplus._M_p;
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = &DAT_00000001;
  local_80.field_2._M_local_buf[0] = ' ';
  views._M_len = 3;
  views._M_array = (iterator)&tgt2;
  local_80._M_string_length = (size_type)paVar1;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  if ((pcVar2->MakeSilentFlag)._M_string_length != 0) {
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(pcVar2->MakeSilentFlag)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (*(char *)((long)&pcVar2[1].FindMakeProgramFile._M_string_length + 1) == '\x01') {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (tgt->_M_string_length != 0) {
    cmOutputConverter::MaybeRelativeToTopBinDir(&tgt2,this_00,tgt);
    cmSystemTools::ConvertToOutputSlashes(&tgt2);
    if (this->MakeCommandEscapeTargetTwice == true) {
      str._M_str = tgt2._M_dataplus._M_p;
      str._M_len = tgt2._M_string_length;
      cmOutputConverter::EscapeForShell_abi_cxx11_
                (&local_80,this_00,str,true,false,false,false,false);
      std::__cxx11::string::operator=((string *)&tgt2,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,
                        CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                 local_80.field_2._M_local_buf[0]) + 1);
      }
    }
    str_00._M_str = tgt2._M_dataplus._M_p;
    str_00._M_len = tgt2._M_string_length;
    cmOutputConverter::EscapeForShell_abi_cxx11_
              (&local_80,this_00,str_00,true,false,false,false,false);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tgt2._M_dataplus._M_p != &tgt2.field_2) {
      operator_delete(tgt2._M_dataplus._M_p,tgt2.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall(
  const std::string& makefile, const std::string& tgt)
{
  // Call make on the given file.
  std::string cmd = cmStrCat(
    "$(MAKE) $(MAKESILENT) -f ",
    this->ConvertToOutputFormat(makefile, cmOutputConverter::SHELL), ' ');

  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  // Pass down verbosity level.
  if (!gg->MakeSilentFlag.empty()) {
    cmd += gg->MakeSilentFlag;
    cmd += " ";
  }

  // Most unix makes will pass the command line flags to make down to
  // sub-invoked makes via an environment variable.  However, some
  // makes do not support that, so you have to pass the flags
  // explicitly.
  if (gg->PassMakeflags) {
    cmd += "-$(MAKEFLAGS) ";
  }

  // Add the target.
  if (!tgt.empty()) {
    // The make target is always relative to the top of the build tree.
    std::string tgt2 = this->MaybeRelativeToTopBinDir(tgt);

    // The target may have been written with windows paths.
    cmSystemTools::ConvertToOutputSlashes(tgt2);

    // Escape one extra time if the make tool requires it.
    if (this->MakeCommandEscapeTargetTwice) {
      tgt2 = this->EscapeForShell(tgt2, true, false);
    }

    // The target name is now a string that should be passed verbatim
    // on the command line.
    cmd += this->EscapeForShell(tgt2, true, false);
  }
  return cmd;
}